

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateFunctionElimination.cpp
# Opt level: O0

Pass * wasm::createDuplicateFunctionEliminationPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  DuplicateFunctionElimination::DuplicateFunctionElimination((DuplicateFunctionElimination *)this);
  return this;
}

Assistant:

Pass* createDuplicateFunctionEliminationPass() {
  return new DuplicateFunctionElimination();
}